

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-kill.c
# Opt level: O3

void borg_update_kill_new(wchar_t i)

{
  bitflag *flags;
  borg_kill *pbVar1;
  short sVar2;
  ushort uVar3;
  short sVar4;
  wchar_t wVar5;
  monster *pmVar6;
  chunk_conflict *c;
  monster_race *pmVar7;
  _Bool _Var8;
  int iVar9;
  wchar_t wVar10;
  wchar_t wVar11;
  wchar_t wVar12;
  loc grid;
  monster *pmVar13;
  long lVar14;
  int iVar15;
  
  pmVar7 = r_info;
  pbVar1 = borg_kills + i;
  pmVar6 = cave->monsters;
  sVar2 = borg_kills[i].m_idx;
  uVar3 = borg_kills[i].r_idx;
  borg_kills[i].speed = pmVar6[sVar2].mspeed;
  sVar4 = pmVar6[sVar2].maxhp;
  iVar9 = 100;
  if (sVar4 != 0) {
    iVar9 = 1;
    if (1 < sVar4) {
      iVar9 = (int)sVar4;
    }
    iVar9 = (pmVar6[sVar2].hp * 100) / iVar9;
  }
  iVar15 = sVar4 * iVar9;
  pbVar1->power =
       (short)(uint)((ulong)((long)iVar15 * 0x51eb851f) >> 0x25) - (short)(iVar15 >> 0x1f);
  pbVar1->injury = 100 - (short)iVar9;
  pbVar1->level = (int16_t)pmVar7[uVar3].level;
  flags = pmVar7[uVar3].flags;
  _Var8 = flag_has_dbg(flags,0xb,0x15,"r_ptr->flags","RF_NEVER_MOVE");
  if (_Var8) {
    pbVar1->awake = true;
  }
  c = cave;
  grid = (loc)loc((pbVar1->pos).x,(pbVar1->pos).y);
  pmVar13 = square_monster(c,grid);
  pbVar1->m_idx = (int16_t)pmVar13->midx;
  pbVar1->awake = pmVar6[sVar2].m_timed[0] == 0;
  pbVar1->afraid = pmVar6[sVar2].m_timed[3] != 0;
  pbVar1->confused = pmVar6[sVar2].m_timed[2] != 0;
  pbVar1->stunned = pmVar6[sVar2].m_timed[1] != 0;
  pbVar1->spell_flags[0] = (uint)pmVar7[uVar3].spell_flags[0];
  pbVar1->spell_flags[1] = (uint)pmVar7[uVar3].spell_flags[1];
  pbVar1->spell_flags[2] = (uint)pmVar7[uVar3].spell_flags[2];
  iVar9 = 0;
  iVar15 = 1;
  do {
    _Var8 = flag_has_dbg(pmVar7[uVar3].spell_flags,0xc,iVar15,"r_ptr->spell_flags","k");
    if (_Var8) {
      lVar14 = (long)iVar9;
      iVar9 = iVar9 + 1;
      pbVar1->spell[lVar14] = (uint8_t)iVar15;
    }
    iVar15 = iVar15 + 1;
  } while (iVar15 != 0x5c);
  pbVar1->ranged_attack = (uint8_t)iVar9;
  if (borg_morgoth_id == pbVar1->r_idx) {
    wVar5 = (pbVar1->pos).y;
    wVar10 = borg_panel_hgt();
    wVar11 = borg_panel_hgt();
    wVar12 = borg_panel_hgt();
    wVar12 = wVar12 * ((wVar5 - wVar10 / 2) / wVar11);
    if (wVar12 < L'\x01') {
      wVar12 = L'\0';
    }
    morgy_panel_y =
         L'B' - (Term->hgt - (row_top_map[Term->sidebar_mode] + row_bottom_map[Term->sidebar_mode]))
                / (int)(uint)tile_height;
    if (wVar12 < morgy_panel_y) {
      morgy_panel_y = wVar12;
    }
    wVar5 = (pbVar1->pos).x;
    wVar10 = borg_panel_wid();
    wVar11 = borg_panel_wid();
    wVar12 = borg_panel_wid();
    wVar12 = wVar12 * ((wVar5 - wVar10 / 2) / wVar11);
    if (wVar12 < L'\x01') {
      wVar12 = L'\0';
    }
    morgy_panel_x = L'Æ' - (~col_map[Term->sidebar_mode] + Term->wid) / (int)(uint)tile_width;
    if (wVar12 < morgy_panel_x) {
      morgy_panel_x = wVar12;
    }
  }
  _Var8 = flag_has_dbg(flags,0xb,0x2e,"r_ptr->flags","RF_PASS_WALL");
  if (_Var8) {
    if ((borg_grids[(pbVar1->pos).y][(pbVar1->pos).x].feat != '\x01') &&
       (_Var8 = flag_has_dbg(flags,0xb,0x2e,"r_ptr->flags","RF_PASS_WALL"), _Var8)) {
      borg_grids[(pbVar1->pos).y][(pbVar1->pos).x].feat = '\x15';
    }
  }
  else {
    borg_grids[(pbVar1->pos).y][(pbVar1->pos).x].feat = '\x01';
  }
  return;
}

Assistant:

static void borg_update_kill_new(int i)
{
    int k   = 0;
    int j   = 0;
    int num = 0;
    int pct;

    borg_kill *kill            = &borg_kills[i];

    struct monster      *m_ptr = &cave->monsters[kill->m_idx];
    struct monster_race *r_ptr = &r_info[kill->r_idx];

    /* Extract the monster speed */
    kill->speed = (m_ptr->mspeed);

    /* Extract max hitpoints */
    /* This is a cheat.  Borg does not look
     * at the bar at the bottom and frankly that would take a lot of code.
     * It would involve targeting every monster to read their individual bar.
     * then keeping track of it.  When the borg has telepathy this would
     * cripple him down and be tremendously slow.
     *
     * This cheat is not too bad.  A human could draw the same info from
     * from the screen.
     *
     * Basically the borg is cheating the real hit points of the monster then
     * using that information to calculate the estimated hp of the monster.
     * Its the same basic tactic that we would use.
     *
     * Kill->power is used a lot in borg_danger,
     * for calculating damage from breath attacks.
     */
    if (m_ptr->maxhp) {
        /* Cheat the "percent" of health */
        pct = 100L * m_ptr->hp / ((m_ptr->maxhp > 1) ? m_ptr->maxhp : 1);
    } else {
        pct = 100;
    }

    /* Compute estimated HP based on number of * in monster health bar */
    kill->power  = (m_ptr->maxhp * pct) / 100;
    kill->injury = 100 - pct;

    /* Extract the Level*/
    kill->level = r_ptr->level;

    /* Some monsters never move */
    if (rf_has(r_ptr->flags, RF_NEVER_MOVE))
        kill->awake = true;

    /* Cheat in the game's index of the monster.
     * Used in tracking monsters
     */
    kill->m_idx = square_monster(cave, loc(kill->pos.x, kill->pos.y))->midx;

    /* Is it sleeping */
    if (m_ptr->m_timed[MON_TMD_SLEEP] == 0)
        kill->awake = true;
    else
        kill->awake = false;

    /* Is it afraid */
    if (m_ptr->m_timed[MON_TMD_FEAR] == 0)
        kill->afraid = false;
    else
        kill->afraid = true;

    /* Is it confused */
    if (m_ptr->m_timed[MON_TMD_CONF] == 0)
        kill->confused = false;
    else
        kill->confused = true;

    /* Is it stunned*/
    if (m_ptr->m_timed[MON_TMD_STUN] == 0)
        kill->stunned = false;
    else
        kill->stunned = true;

    /* Preload the spells from the race into this individual monster */
    kill->spell_flags[0] = r_ptr->spell_flags[0];
    kill->spell_flags[1] = r_ptr->spell_flags[1];
    kill->spell_flags[2] = r_ptr->spell_flags[2];

    /* Extract the spells */
    for (k = RSF_NONE + 1; k < RSF_MAX; k++) {
        if (rsf_has(r_ptr->spell_flags, k))
            kill->spell[num++] = k;
    }

    /* Store the number of ranged attacks */
    kill->ranged_attack = num;

    /* We want to remember Morgy's panel */
    if (kill->r_idx == borg_morgoth_id) {
        j = ((kill->pos.y - borg_panel_hgt() / 2) / borg_panel_hgt())
            * borg_panel_hgt();
        if (j < 0)
            j = 0;
        if (j > DUNGEON_HGT - SCREEN_HGT)
            j = DUNGEON_HGT - SCREEN_HGT;
        morgy_panel_y = j;

        j = ((kill->pos.x - borg_panel_wid() / 2) / borg_panel_wid())
            * borg_panel_wid();
        if (j < 0)
            j = 0;
        if (j > DUNGEON_WID - SCREEN_WID)
            j = DUNGEON_WID - SCREEN_WID;
        morgy_panel_x = j;
    }

    /* Hack -- Force the monster to be sitting on a floor
     * grid unless that monster can pass through walls
     */
    if (!rf_has(r_ptr->flags, RF_PASS_WALL)) {
        borg_grids[kill->pos.y][kill->pos.x].feat = FEAT_FLOOR;
    }

    /* Hack -- Force the ghostly monster to be in a wall
     * grid until the grid is proven to be something else
     */
    if (borg_grids[kill->pos.y][kill->pos.x].feat != FEAT_FLOOR
        && rf_has(r_ptr->flags, RF_PASS_WALL)) {
        borg_grids[kill->pos.y][kill->pos.x].feat = FEAT_GRANITE;
    }
}